

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_MBCSToUnicodeWithOffsets_63(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  UChar *pUVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  UConverterSharedData *pUVar15;
  long lVar16;
  long lVar17;
  int8_t iVar18;
  UBool UVar19;
  char cVar20;
  int iVar21;
  UChar32 UVar22;
  UConverter *pUVar23;
  undefined7 extraout_var;
  uint uVar24;
  UChar *pUVar25;
  int32_t *piVar26;
  UChar UVar27;
  uint uVar28;
  ulong uVar29;
  uint *puVar30;
  uint *puVar31;
  byte *pbVar32;
  byte *pbVar33;
  int *piVar34;
  uint32_t uVar35;
  byte *pbVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  UConverter *pUVar41;
  long lVar42;
  int32_t (*stateTable) [256];
  uint uVar43;
  UErrorCode UVar44;
  undefined8 unaff_R13;
  int32_t iVar45;
  UConverter *unaff_R14;
  UConverter *pUVar46;
  long lVar47;
  int iVar48;
  int32_t *offsets;
  UChar *target;
  UConverter *local_88;
  byte *local_80;
  UChar *local_78;
  UConverter *local_70;
  uint local_64;
  UConverter *local_60;
  UConverter *local_58;
  UErrorCode *local_50;
  undefined8 local_48;
  byte *local_40;
  int32_t (*local_38) [256];
  
  pUVar41 = pArgs->converter;
  if ('\0' < pUVar41->preToULength) {
    ucnv_extContinueMatchToU_63(pUVar41,pArgs,-1,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
    unaff_R14 = pUVar41;
    if (pUVar41->preToULength < '\0') {
      return;
    }
  }
  pUVar15 = pUVar41->sharedData;
  local_60 = (UConverter *)pArgs;
  if ((pUVar15->mbcs).countStates != '\x01') {
    pbVar36 = (byte *)pArgs->sourceLimit;
    local_78 = pArgs->targetLimit;
    offsets = pArgs->offsets;
    uVar29 = CONCAT71((int7)((ulong)unaff_R13 >> 8),pUVar41->toULength);
    uVar28 = pUVar41->mode;
    if ((char)uVar28 == '\0') {
      uVar28 = (uint)(pUVar15->mbcs).dbcsOnlyState;
    }
    stateTable = *(int32_t (**) [256])
                  ((pUVar15->mbcs).sbcsIndex +
                  (ulong)(((byte)pUVar41->options & 0x10) >> 4) * 4 + -0x18);
    local_48 = (pUVar15->mbcs).unicodeCodeUnits;
    uVar35 = pUVar41->toUnicodeStatus;
    local_88 = (UConverter *)0x0;
    pUVar23 = (UConverter *)(ulong)-(uint)(pUVar41->toULength != '\0');
    pbVar32 = (byte *)pArgs->source;
    pUVar25 = local_78;
    target = pArgs->target;
switchD_002ae2cb_caseD_3:
    local_80 = pbVar32;
    uVar43 = (uint)pUVar23;
    if (local_80 < pbVar36) {
      if (target < pUVar25) {
        if ((char)uVar29 == '\0') {
          puVar30 = (uint *)offsets;
          if (offsets == (int32_t *)0x0) {
            do {
              uVar24 = *(uint *)((long)*stateTable +
                                (ulong)*local_80 * 4 + (ulong)((uVar28 & 0xff) << 10));
              if ((int)uVar24 < 0) {
                if (0x800fffff < uVar24) goto LAB_002ae314;
                local_80 = local_80 + 1;
                *target = (UChar)uVar24;
                uVar28 = 0;
              }
              else {
                uVar28 = uVar24 >> 0x18;
                uVar35 = uVar24 & 0xffffff;
                pbVar32 = local_80 + 1;
                pbVar33 = local_80;
                if (((pbVar36 <= pbVar32) ||
                    (uVar24 = *(uint *)((long)*stateTable +
                                       (ulong)*pbVar32 * 4 + (ulong)(uVar28 << 10)),
                    (uVar24 & 0x80f00000) != 0x80400000)) ||
                   (0xfffd < local_48[(uVar24 & 0xffff) + uVar35])) goto LAB_002ae0ba;
                local_80 = local_80 + 2;
                *target = local_48[(uVar24 & 0xffff) + uVar35];
                uVar28 = uVar24 >> 0x18 & 0xffffff7f;
                uVar35 = 0;
              }
              target = target + 1;
              unaff_R14 = (UConverter *)0x0;
              pUVar46 = (UConverter *)0x0;
            } while ((local_80 < pbVar36) && (target < pUVar25));
          }
          else {
            do {
              uVar24 = *(uint *)((long)*stateTable +
                                (ulong)*local_80 * 4 + (ulong)((uVar28 & 0xff) << 10));
              uVar43 = (uint)pUVar23;
              if ((int)uVar24 < 0) {
                if (0x800fffff < uVar24) goto LAB_002ae314;
                local_80 = local_80 + 1;
                *target = (UChar)uVar24;
                if (puVar30 == (uint *)0x0) {
                  puVar31 = (uint *)0x0;
                  uVar28 = 0;
                }
                else {
                  puVar31 = puVar30 + 1;
                  *puVar30 = uVar43;
                  pUVar23 = (UConverter *)(ulong)((int)local_88 + 1);
                  uVar28 = 0;
                  offsets = (int32_t *)puVar31;
                  local_88 = pUVar23;
                }
              }
              else {
                uVar28 = uVar24 >> 0x18;
                uVar35 = uVar24 & 0xffffff;
                pbVar32 = local_80 + 1;
                if (((pbVar36 <= pbVar32) ||
                    (uVar24 = *(uint *)((long)*stateTable +
                                       (ulong)*pbVar32 * 4 + (ulong)(uVar28 << 10)),
                    pUVar25 = local_78, (uVar24 & 0x80f00000) != 0x80400000)) ||
                   (0xfffd < local_48[(uVar24 & 0xffff) + uVar35])) {
                  local_88._0_4_ = (int)local_88 + 1;
                  pbVar33 = local_80;
                  goto LAB_002ae0ba;
                }
                local_80 = local_80 + 2;
                *target = local_48[(uVar24 & 0xffff) + uVar35];
                if (puVar30 == (uint *)0x0) {
                  puVar31 = (uint *)0x0;
                }
                else {
                  puVar31 = puVar30 + 1;
                  *puVar30 = uVar43;
                  pUVar23 = (UConverter *)(ulong)((int)local_88 + 2);
                  offsets = (int32_t *)puVar31;
                  local_88 = pUVar23;
                }
                uVar28 = uVar24 >> 0x18 & 0xffffff7f;
                uVar35 = 0;
              }
              target = target + 1;
              uVar43 = (uint)pUVar23;
              pUVar46 = (UConverter *)0x0;
            } while ((local_80 < pbVar36) &&
                    (puVar30 = puVar31, unaff_R14 = pUVar46, target < pUVar25));
          }
          goto LAB_002ae0c5;
        }
        bVar2 = *local_80;
        pUVar41->toUBytes[(char)uVar29] = bVar2;
        uVar24 = *(uint *)((long)*stateTable + (ulong)bVar2 * 4 + (ulong)((uVar28 & 0xff) << 10));
        local_70 = (UConverter *)((ulong)pUVar23 & 0xffffffff);
        unaff_R14 = (UConverter *)(uVar29 & 0xffffffff);
        uVar43 = uVar28;
        goto LAB_002ae0f6;
      }
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    goto LAB_002ae70f;
  }
  if (((pUVar15->mbcs).unicodeMask & 1) != 0) {
    local_88 = pArgs->converter;
    local_80 = (byte *)pArgs->source;
    pbVar36 = (byte *)pArgs->sourceLimit;
    pUVar25 = pArgs->targetLimit;
    lVar40 = *(long *)((local_88->sharedData->mbcs).sbcsIndex +
                      (ulong)(((byte)local_88->options & 0x10) >> 4) * 4 + -0x18);
    iVar48 = 0;
    offsets = pArgs->offsets;
    target = pArgs->target;
LAB_002ae524:
    UVar44 = U_BUFFER_OVERFLOW_ERROR;
LAB_002ae527:
    iVar37 = iVar48;
    pbVar32 = local_80;
    iVar48 = iVar37 + 1;
    local_80 = pbVar32;
    if (pbVar36 <= pbVar32) goto LAB_002ae6eb;
    if (target < pUVar25) {
      uVar28 = *(uint *)(lVar40 + (ulong)*pbVar32 * 4);
      if ((int)uVar28 < -0x7ff00000) goto LAB_002ae58d;
      if ((uVar28 & 0xd00000) == 0x100000) {
        *target = (ushort)(uVar28 >> 10) & 0x3ff | 0xd800;
        if (offsets == (int32_t *)0x0) {
          piVar34 = (int *)0x0;
        }
        else {
          piVar34 = offsets + 1;
          *offsets = iVar37;
          offsets = piVar34;
        }
        UVar27 = (UChar)uVar28 & 0x3ffU | 0xdc00;
        if (pUVar25 <= target + 1) {
          local_88->UCharErrorBuffer[0] = UVar27;
          local_88->UCharErrorBufferLength = '\x01';
          local_80 = pbVar32 + 1;
          target = target + 1;
          goto LAB_002ae6e5;
        }
        local_80 = pbVar32 + 1;
        pUVar1 = target + 2;
        target[1] = UVar27;
        target = pUVar1;
        if (piVar34 != (int *)0x0) {
          offsets = piVar34 + 1;
          *piVar34 = iVar37;
        }
        goto LAB_002ae524;
      }
      uVar43 = uVar28 >> 0x14 & 0xf;
      if (uVar43 == 7) {
        local_80 = pbVar32 + 1;
        UVar44 = U_ILLEGAL_CHAR_FOUND;
        goto LAB_002ae6e5;
      }
      if (uVar43 != 6) {
        local_80 = pbVar32 + 1;
        if (uVar43 == 2) goto LAB_002ae58d;
        goto LAB_002ae527;
      }
      local_80 = pbVar32 + 1;
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_60->extraInfo = local_80;
        local_88->toUBytes[0] = *pbVar32;
        local_80 = pbVar32 + 1;
        iVar18 = _extToU(local_88,local_88->sharedData,'\x01',&local_80,pbVar36,&target,pUVar25,
                         &offsets,iVar37,*(UBool *)((long)local_60 + 2),pErrorCode);
        local_88->toULength = iVar18;
        iVar48 = ((int)local_80 - *(int *)&local_60->extraInfo) + iVar48;
        if (U_ZERO_ERROR < *pErrorCode) goto LAB_002ae6eb;
        goto LAB_002ae524;
      }
    }
    else {
LAB_002ae6e5:
      *pErrorCode = UVar44;
    }
LAB_002ae6eb:
    local_60->extraInfo = local_80;
    local_60->toUContext = target;
    local_60->sharedData = (UConverterSharedData *)offsets;
    return;
  }
  local_88 = pArgs->converter;
  pbVar36 = (byte *)pArgs->source;
  local_78 = (UChar *)pArgs->sourceLimit;
  target = pArgs->target;
  offsets = pArgs->offsets;
  uVar39 = (ulong)((long)pArgs->targetLimit - (long)target) >> 1;
  uVar28 = (int)local_78 - (int)pbVar36;
  uVar29 = (ulong)uVar28;
  if ((int)uVar39 <= (int)uVar28) {
    uVar29 = uVar39 & 0xffffffff;
  }
  lVar40 = *(long *)((local_88->sharedData->mbcs).sbcsIndex +
                    (ulong)(((byte)local_88->options & 0x10) >> 4) * 4 + -0x18);
  iVar48 = 0;
  local_80 = pbVar36;
  local_50 = pErrorCode;
LAB_002ad9ac:
  pUVar41 = local_88;
  pUVar25 = target;
  pbVar32 = pbVar36;
  if (0xf < (int)uVar29) {
    uVar39 = uVar29 >> 4;
    lVar42 = 0;
    lVar47 = 0;
    iVar37 = (int)uVar39;
    do {
      iVar21 = (int)uVar39;
      uVar28 = *(uint *)(lVar40 + (ulong)local_80[lVar42] * 4);
      target[lVar42] = (UChar)uVar28;
      uVar43 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 1] * 4);
      target[lVar42 + 1] = (UChar)uVar43;
      uVar24 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 2] * 4);
      target[lVar42 + 2] = (UChar)uVar24;
      uVar38 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 3] * 4);
      target[lVar42 + 3] = (UChar)uVar38;
      uVar3 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 4] * 4);
      target[lVar42 + 4] = (UChar)uVar3;
      uVar4 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 5] * 4);
      target[lVar42 + 5] = (UChar)uVar4;
      uVar5 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 6] * 4);
      target[lVar42 + 6] = (UChar)uVar5;
      pbVar33 = local_80 + lVar42 + 8;
      uVar6 = *(uint *)(lVar40 + (ulong)pbVar33[-1] * 4);
      target[lVar42 + 7] = (UChar)uVar6;
      uVar7 = *(uint *)(lVar40 + (ulong)*pbVar33 * 4);
      target[lVar42 + 8] = (UChar)uVar7;
      uVar8 = *(uint *)(lVar40 + (ulong)pbVar33[1] * 4);
      target[lVar42 + 9] = (UChar)uVar8;
      uVar9 = *(uint *)(lVar40 + (ulong)pbVar33[2] * 4);
      target[lVar42 + 10] = (UChar)uVar9;
      uVar10 = *(uint *)(lVar40 + (ulong)pbVar33[3] * 4);
      target[lVar42 + 0xb] = (UChar)uVar10;
      uVar11 = *(uint *)(lVar40 + (ulong)pbVar33[4] * 4);
      target[lVar42 + 0xc] = (UChar)uVar11;
      uVar12 = *(uint *)(lVar40 + (ulong)pbVar33[5] * 4);
      target[lVar42 + 0xd] = (UChar)uVar12;
      uVar13 = *(uint *)(lVar40 + (ulong)pbVar33[6] * 4);
      target[lVar42 + 0xe] = (UChar)uVar13;
      lVar16 = lVar42 + 0x10;
      uVar14 = *(uint *)(lVar40 + (ulong)local_80[lVar42 + 0xf] * 4);
      lVar17 = lVar47 + 0x20;
      target[lVar42 + 0xf] = (UChar)uVar14;
      if (-0x7ff00001 <
          (int)(uVar10 | uVar11 | uVar12 | uVar13 | uVar14 |
               uVar6 | uVar7 | uVar8 | uVar9 |
               uVar3 | uVar4 | uVar5 | uVar24 | uVar38 | uVar28 | uVar43)) {
        pUVar25 = (UChar *)((long)target + lVar47);
        target = pUVar25;
        goto LAB_002adbe3;
      }
      lVar47 = lVar47 + 0x20;
      lVar42 = lVar42 + 0x10;
      uVar39 = (ulong)(iVar21 - 1);
    } while (1 < iVar21);
    pUVar25 = (UChar *)((long)target + lVar47);
    iVar21 = 0;
    target = (UChar *)((long)target + lVar17);
    lVar42 = lVar16;
LAB_002adbe3:
    local_80 = local_80 + lVar42;
    iVar37 = iVar37 - iVar21;
    iVar21 = iVar37 * 0x10;
    uVar29 = (ulong)(uint)((int)uVar29 + iVar37 * -0x10);
    pArgs = (UConverterToUnicodeArgs *)local_60;
    if (offsets != (int32_t *)0x0) {
      for (; 0 < iVar37; iVar37 = iVar37 + -1) {
        *offsets = iVar48;
        offsets[1] = iVar48 + 1;
        offsets[2] = iVar48 + 2;
        offsets[3] = iVar48 + 3;
        offsets[4] = iVar48 + 4;
        offsets[5] = iVar48 + 5;
        offsets[6] = iVar48 + 6;
        offsets[7] = iVar48 + 7;
        offsets[8] = iVar48 + 8;
        offsets[9] = iVar48 + 9;
        offsets[10] = iVar48 + 10;
        offsets[0xb] = iVar48 + 0xb;
        offsets[0xc] = iVar48 + 0xc;
        offsets[0xd] = iVar48 + 0xd;
        offsets[0xe] = iVar48 + 0xe;
        offsets[0xf] = iVar48 + 0xf;
        iVar48 = iVar48 + 0x10;
        offsets = offsets + 0x10;
      }
      pbVar32 = pbVar36 + iVar21;
    }
  }
  for (; 0 < (int)uVar29; uVar29 = (ulong)((int)uVar29 - 1)) {
    iVar37 = (int)local_80 - (int)pbVar32;
    iVar21 = (int)local_80 + -1;
LAB_002adc95:
    pbVar33 = local_80;
    local_80 = pbVar33;
    if (local_78 <= pbVar33) break;
    pbVar36 = pbVar33 + 1;
    uVar28 = *(uint *)(lVar40 + (ulong)*pbVar33 * 4);
    local_80 = pbVar36;
    if ((-0x7ff00001 < (int)uVar28) && (uVar43 = uVar28 >> 0x14 & 0xf, uVar43 != 2)) {
      iVar21 = iVar21 + 1;
      iVar37 = iVar37 + 1;
      if (uVar43 != 6) goto code_r0x002adcd8;
      goto LAB_002adcfb;
    }
    target = pUVar25 + 1;
    *pUVar25 = (UChar)uVar28;
    pUVar25 = target;
  }
  goto LAB_002ae752;
LAB_002ae314:
  pUVar46 = (UConverter *)0x0;
  goto LAB_002ae0c5;
LAB_002ae0ba:
  local_80 = pbVar32;
  pUVar41->toUBytes[0] = *pbVar33;
  pUVar46 = (UConverter *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
LAB_002ae0c5:
  if (pbVar36 <= local_80) {
LAB_002ae70c:
    uVar29 = (ulong)pUVar46 & 0xffffffff;
    goto LAB_002ae70f;
  }
  if (pUVar25 <= target) {
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    goto LAB_002ae70c;
  }
  pUVar41->toUBytes[(ulong)pUVar46 & 0xff] = *local_80;
  local_70 = (UConverter *)(ulong)uVar43;
  pUVar25 = local_78;
  unaff_R14 = pUVar46;
  uVar43 = uVar28;
LAB_002ae0f6:
  pUVar1 = target;
  pbVar32 = local_80 + 1;
  local_64 = (int)unaff_R14 + 1;
  uVar29 = (ulong)local_64;
  local_88 = (UConverter *)(ulong)((int)local_88 + 1);
  if (-1 < (int)uVar24) {
    uVar28 = uVar24 >> 0x18;
    uVar35 = uVar35 + (uVar24 & 0xffffff);
    pUVar23 = local_70;
    goto switchD_002ae2cb_caseD_3;
  }
  pUVar41->mode = uVar43 & 0xff;
  uVar28 = uVar24 >> 0x18 & 0x7f;
  uVar38 = uVar24 >> 0x14 & 0xf;
  if (uVar38 == 0) {
switchD_002ae2cb_caseD_2:
    *target = (UChar)uVar24;
LAB_002ae2dc:
    target = target + 1;
    piVar26 = offsets;
    pUVar1 = target;
  }
  else {
    iVar45 = (int32_t)local_70;
    local_80 = pbVar32;
    if (uVar38 != 5) {
      if (uVar38 != 4) {
        pUVar23 = local_88;
        if ((uVar24 & 0xd00000) == 0x100000) {
          *target = (ushort)(uVar24 >> 10) & 0x3ff | 0xd800;
          if (offsets == (int32_t *)0x0) {
            piVar26 = (int32_t *)0x0;
          }
          else {
            piVar26 = offsets + 1;
            *offsets = iVar45;
            unaff_R14 = local_70;
            offsets = piVar26;
          }
          UVar27 = (UChar)uVar24 & 0x3ffU | 0xdc00;
          if (pUVar25 <= target + 1) {
            pUVar41->UCharErrorBuffer[0] = UVar27;
            goto LAB_002ae840;
          }
          pUVar1 = target + 2;
          target[1] = UVar27;
          uVar29 = 0;
          uVar35 = 0;
          target = pUVar1;
          if (piVar26 == (int32_t *)0x0) goto switchD_002ae2cb_caseD_3;
          *piVar26 = iVar45;
          goto LAB_002ae305;
        }
        uVar35 = 0;
        uVar29 = 0;
        switch(uVar38) {
        case 2:
          goto switchD_002ae2cb_caseD_2;
        default:
          goto switchD_002ae2cb_caseD_3;
        case 6:
          goto switchD_002ae2cb_caseD_6;
        case 7:
          goto switchD_002ae2cb_caseD_7;
        case 8:
          uVar29 = 0;
          uVar35 = 0;
          if ((pUVar41->sharedData->mbcs).dbcsOnlyState == '\0') goto switchD_002ae2cb_caseD_3;
          goto LAB_002ae31f;
        }
      }
      uVar43 = uVar35 + (uVar24 & 0xffff);
      UVar27 = local_48[uVar43];
      if ((ushort)UVar27 < 0xfffe) {
LAB_002ae170:
        *target = UVar27;
        goto LAB_002ae2dc;
      }
      if (UVar27 == L'\xfffe') {
        local_58 = pUVar41;
        local_50 = pErrorCode;
        local_40 = pbVar36;
        local_38 = stateTable;
        UVar22 = ucnv_MBCSGetFallback(&pUVar41->sharedData->mbcs,uVar43);
        pUVar41 = local_58;
        pbVar36 = local_40;
        stateTable = local_38;
        pUVar25 = local_78;
        pErrorCode = local_50;
        if (UVar22 == 0xfffe) goto switchD_002ae2cb_caseD_6;
        *pUVar1 = (UChar)UVar22;
        piVar26 = offsets;
        pUVar1 = pUVar1 + 1;
        goto joined_r0x002ae2f0;
      }
switchD_002ae2cb_caseD_7:
      uVar43 = uVar28;
LAB_002ae31f:
      *pErrorCode = U_ILLEGAL_CHAR_FOUND;
      uVar28 = uVar43;
switchD_002ae2cb_caseD_6:
      pUVar46 = local_60;
      uVar29 = 0;
      uVar35 = 0;
      pUVar23 = local_88;
      if ((char)local_64 == '\0') goto switchD_002ae2cb_caseD_3;
      if (U_ZERO_ERROR < *pErrorCode) {
        if ((char)local_64 < '\x02') goto LAB_002ae831;
        local_78 = (UChar *)CONCAT44(local_78._4_4_,
                                     (uint)((pUVar41->sharedData->mbcs).dbcsOnlyState != '\0'));
        local_88 = (UConverter *)((ulong)(local_64 & 0xff) - 1);
        uVar35 = 0;
        local_48 = (uint16_t *)(CONCAT44(local_48._4_4_,uVar28) & 0xffffffff000000ff);
        lVar40 = 0;
        local_58 = pUVar41;
        goto LAB_002ae7f7;
      }
      local_60->extraInfo = pbVar32;
      iVar18 = _extToU(pUVar41,pUVar41->sharedData,(char)local_64,&local_80,pbVar36,&target,pUVar25,
                       &offsets,(int32_t)local_70,
                       *(UBool *)((long)&local_60->fromUCharErrorBehaviour + 2),pErrorCode);
      uVar29 = CONCAT71(extraout_var,iVar18) & 0xffffffff;
      local_88 = (UConverter *)
                 (ulong)(uint)((int)local_88 + ((int)local_80 - *(int *)&pUVar46->extraInfo));
      uVar35 = 0;
      pUVar23 = local_88;
      pbVar32 = local_80;
      pUVar25 = local_78;
      unaff_R14 = pUVar46;
      if (U_ZERO_ERROR < *pErrorCode) goto LAB_002ae70f;
      goto switchD_002ae2cb_caseD_3;
    }
    UVar27 = local_48[(uVar24 & 0xffff) + uVar35];
    if ((ushort)UVar27 < 0xd800) {
      *target = UVar27;
      goto LAB_002ae2dc;
    }
    uVar43 = (uVar24 & 0xffff) + uVar35 + 1;
    if (0xdfff < (ushort)UVar27) {
      if ((UVar27 & 0xfffeU) == 0xe000) {
        UVar27 = local_48[uVar43];
        goto LAB_002ae170;
      }
      uVar43 = uVar28;
      if (UVar27 != L'\xffff') goto switchD_002ae2cb_caseD_6;
      goto LAB_002ae31f;
    }
    *target = UVar27 & 0xdbff;
    if (offsets == (int32_t *)0x0) {
      piVar26 = (int32_t *)0x0;
    }
    else {
      piVar26 = offsets + 1;
      *offsets = iVar45;
      unaff_R14 = local_70;
      offsets = piVar26;
    }
    if (pUVar25 <= target + 1) {
      pUVar41->UCharErrorBuffer[0] = local_48[uVar43];
LAB_002ae840:
      target = target + 1;
      pUVar41->UCharErrorBufferLength = '\x01';
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      uVar29 = 0;
      uVar35 = 0;
      goto LAB_002ae70f;
    }
    pUVar1 = target + 2;
    target[1] = local_48[uVar43];
  }
joined_r0x002ae2f0:
  uVar35 = 0;
  uVar29 = 0;
  pUVar23 = local_88;
  target = pUVar1;
  if (piVar26 == (int32_t *)0x0) goto switchD_002ae2cb_caseD_3;
  *piVar26 = (int32_t)local_70;
LAB_002ae305:
  offsets = piVar26 + 1;
  uVar29 = 0;
  uVar35 = 0;
  pUVar23 = local_88;
  goto switchD_002ae2cb_caseD_3;
LAB_002ae7f7:
  pUVar41 = local_58;
  if (local_88 == (UConverter *)lVar40) {
LAB_002ae831:
    uVar35 = 0;
    uVar29 = (ulong)local_64;
    local_80 = pbVar32;
LAB_002ae70f:
    pUVar41->toUnicodeStatus = uVar35;
    pUVar41->mode = uVar28 & 0xff;
    pUVar41->toULength = (int8_t)uVar29;
    local_60->extraInfo = local_80;
    local_60->toUContext = target;
    local_60->sharedData = (UConverterSharedData *)offsets;
    return;
  }
  UVar19 = isSingleOrLead(stateTable,(uint8_t)local_48,(UBool)local_78,
                          local_58->toUBytes[lVar40 + 1]);
  pUVar41 = local_58;
  pUVar23 = local_60;
  if (UVar19 != '\0') {
    uVar29 = lVar40 + 1;
    cVar20 = (char)unaff_R14 - (char)lVar40;
    if ((int)pbVar32 - (int)local_60->extraInfo < (int)cVar20) {
      cVar20 = (((char)pbVar32 - (char)unaff_R14) + (char)lVar40) - (char)local_60->extraInfo;
      local_58->preToULength = cVar20;
      memcpy(local_58->preToU,local_58->toUBytes + lVar40 + 1,-(long)cVar20);
      local_80 = (byte *)pUVar23->extraInfo;
      uVar35 = 0;
    }
    else {
      local_80 = pbVar32 + -(long)cVar20;
    }
    goto LAB_002ae70f;
  }
  lVar40 = lVar40 + 1;
  goto LAB_002ae7f7;
LAB_002ae58d:
  pUVar1 = target + 1;
  *target = (UChar)uVar28;
  local_80 = pbVar32 + 1;
  target = pUVar1;
  if (offsets != (int32_t *)0x0) {
    *offsets = iVar37;
    offsets = offsets + 1;
  }
  goto LAB_002ae524;
code_r0x002adcd8:
  if (uVar43 != 7) goto LAB_002adc95;
  *local_50 = U_ILLEGAL_CHAR_FOUND;
LAB_002adcfb:
  if (offsets != (int32_t *)0x0) {
    for (; 1 < iVar37; iVar37 = iVar37 + -1) {
      *offsets = iVar48;
      iVar48 = iVar48 + 1;
      offsets = offsets + 1;
    }
  }
  if (U_ZERO_ERROR < *local_50) goto LAB_002ae752;
  local_88->toUBytes[0] = *pbVar33;
  iVar18 = _extToU(local_88,local_88->sharedData,'\x01',&local_80,(uint8_t *)local_78,&target,
                   pArgs->targetLimit,&offsets,iVar48,pArgs->flush,local_50);
  pUVar41->toULength = iVar18;
  iVar37 = (int)local_80;
  if (U_ZERO_ERROR < *local_50) {
    iVar48 = (iVar48 + iVar37) - iVar21;
    pbVar32 = pbVar36;
LAB_002ae752:
    if (((*local_50 < U_ILLEGAL_ARGUMENT_ERROR) && (local_80 < local_78)) &&
       (pArgs->targetLimit <= target)) {
      *local_50 = U_BUFFER_OVERFLOW_ERROR;
    }
    if (offsets == (int32_t *)0x0) {
      offsets = (int *)0x0;
    }
    else {
      for (lVar40 = (long)pbVar32 - (long)local_80; lVar40 != 0; lVar40 = lVar40 + 1) {
        *offsets = iVar48;
        offsets = offsets + 1;
        iVar48 = iVar48 + 1;
      }
    }
    pArgs->source = (char *)local_80;
    pArgs->target = target;
    pArgs->offsets = offsets;
    return;
  }
  iVar48 = (iVar48 + iVar37) - iVar21;
  uVar39 = (ulong)((long)pArgs->targetLimit - (long)target) >> 1;
  uVar28 = (int)local_78 - iVar37;
  uVar29 = (ulong)uVar28;
  if ((int)uVar39 <= (int)uVar28) {
    uVar29 = uVar39 & 0xffffffff;
  }
  goto LAB_002ad9ac;
}

Assistant:

U_CFUNC void
ucnv_MBCSToUnicodeWithOffsets(UConverterToUnicodeArgs *pArgs,
                          UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit;
    UChar *target;
    const UChar *targetLimit;
    int32_t *offsets;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;
    int8_t byteIndex;
    uint8_t *bytes;

    int32_t sourceIndex, nextSourceIndex;

    int32_t entry;
    UChar c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /*
         * pass sourceIndex=-1 because we continue from an earlier buffer
         * in the future, this may change with continuous offsets
         */
        ucnv_extContinueMatchToU(cnv, pArgs, -1, pErrorCode);

        if(U_FAILURE(*pErrorCode) || cnv->preToULength<0) {
            return;
        }
    }

    if(cnv->sharedData->mbcs.countStates==1) {
        if(!(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
            ucnv_MBCSSingleToBMPWithOffsets(pArgs, pErrorCode);
        } else {
            ucnv_MBCSSingleToUnicodeWithOffsets(pArgs, pErrorCode);
        }
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    target=pArgs->target;
    targetLimit=pArgs->targetLimit;
    offsets=pArgs->offsets;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;
    byteIndex=cnv->toULength;
    bytes=cnv->toUBytes;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex=byteIndex==0 ? 0 : -1;
    nextSourceIndex=0;

    /* conversion loop */
    while(source<sourceLimit) {
        /*
         * This following test is to see if available input would overflow the output.
         * It does not catch output of more than one code unit that
         * overflows as a result of a surrogate pair or callback output
         * from the last source byte.
         * Therefore, those situations also test for overflows and will
         * then break the loop, too.
         */
        if(target>=targetLimit) {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }

        if(byteIndex==0) {
            /* optimized loop for 1/2-byte input and BMP output */
            if(offsets==NULL) {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            } else /* offsets!=NULL */ {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=(nextSourceIndex+=2);
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            ++nextSourceIndex;
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=++nextSourceIndex;
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            }

            /*
             * these tests and break statements could be put inside the loop
             * if C had "break outerLoop" like Java
             */
            if(source>=sourceLimit) {
                break;
            }
            if(target>=targetLimit) {
                /* target is full */
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                break;
            }

            ++nextSourceIndex;
            bytes[byteIndex++]=*source++;
        } else /* byteIndex>0 */ {
            ++nextSourceIndex;
            entry=stateTable[state][bytes[byteIndex++]=*source++];
        }

        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
            continue;
        }

        /* save the previous state for proper extension mapping with SI/SO-stateful converters */
        cnv->mode=state;

        /* set the next state early so that we can reuse the entry variable */
        state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_VALID_16) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset];
            if(c<0xfffe) {
                /* output BMP code point */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xfffe) {
                if(UCNV_TO_U_USE_FALLBACK(cnv) && (entry=(int32_t)ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                    /* output fallback BMP code point */
                    *target++=(UChar)entry;
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                    byteIndex=0;
                }
            } else {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_16) {
            /* output BMP code point */
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
        } else if(action==MBCS_STATE_VALID_16_PAIR) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset++];
            if(c<0xd800) {
                /* output BMP code point below 0xd800 */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                /* output roundtrip or fallback surrogate pair */
                *target++=(UChar)(c&0xdbff);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
                if(target<targetLimit) {
                    *target++=unicodeCodeUnits[offset];
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                } else {
                    /* target overflow */
                    cnv->UCharErrorBuffer[0]=unicodeCodeUnits[offset];
                    cnv->UCharErrorBufferLength=1;
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                    offset=0;
                    break;
                }
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                *target++=unicodeCodeUnits[offset];
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xffff) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                  (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
        ) {
            entry=MBCS_ENTRY_FINAL_VALUE(entry);
            /* output surrogate pair */
            *target++=(UChar)(0xd800|(UChar)(entry>>10));
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
            c=(UChar)(0xdc00|(UChar)(entry&0x3ff));
            if(target<targetLimit) {
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
            } else {
                /* target overflow */
                cnv->UCharErrorBuffer[0]=c;
                cnv->UCharErrorBufferLength=1;
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                offset=0;
                break;
            }
        } else if(action==MBCS_STATE_CHANGE_ONLY) {
            /*
             * This serves as a state change without any output.
             * It is useful for reading simple stateful encodings,
             * for example using just Shift-In/Shift-Out codes.
             * The 21 unused bits may later be used for more sophisticated
             * state transitions.
             */
            if(cnv->sharedData->mbcs.dbcsOnlyState==0) {
                byteIndex=0;
            } else {
                /* SI/SO are illegal for DBCS-only conversion */
                state=(uint8_t)(cnv->mode); /* restore the previous state */

                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            byteIndex=0;
        }

        /* end of action codes: prepare for a new character */
        offset=0;

        if(byteIndex==0) {
            sourceIndex=nextSourceIndex;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            if(byteIndex>1) {
                /*
                 * Ticket 5691: consistent illegal sequences:
                 * - We include at least the first byte in the illegal sequence.
                 * - If any of the non-initial bytes could be the start of a character,
                 *   we stop the illegal sequence before the first one of those.
                 */
                UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
                int8_t i;
                for(i=1;
                    i<byteIndex && !isSingleOrLead(stateTable, state, isDBCSOnly, bytes[i]);
                    ++i) {}
                if(i<byteIndex) {
                    /* Back out some bytes. */
                    int8_t backOutDistance=byteIndex-i;
                    int32_t bytesFromThisBuffer=(int32_t)(source-(const uint8_t *)pArgs->source);
                    byteIndex=i;  /* length of reported illegal byte sequence */
                    if(backOutDistance<=bytesFromThisBuffer) {
                        source-=backOutDistance;
                    } else {
                        /* Back out bytes from the previous buffer: Need to replay them. */
                        cnv->preToULength=(int8_t)(bytesFromThisBuffer-backOutDistance);
                        /* preToULength is negative! */
                        uprv_memcpy(cnv->preToU, bytes+i, -cnv->preToULength);
                        source=(const uint8_t *)pArgs->source;
                    }
                }
            }
            break;
        } else /* unassigned sequences indicated with byteIndex>0 */ {
            /* try an extension mapping */
            pArgs->source=(const char *)source;
            byteIndex=_extToU(cnv, cnv->sharedData,
                              byteIndex, &source, sourceLimit,
                              &target, targetLimit,
                              &offsets, sourceIndex,
                              pArgs->flush,
                              pErrorCode);
            sourceIndex=nextSourceIndex+=(int32_t)(source-(const uint8_t *)pArgs->source);

            if(U_FAILURE(*pErrorCode)) {
                /* not mappable or buffer overflow */
                break;
            }
        }
    }

    /* set the converter state back into UConverter */
    cnv->toUnicodeStatus=offset;
    cnv->mode=state;
    cnv->toULength=byteIndex;

    /* write back the updated pointers */
    pArgs->source=(const char *)source;
    pArgs->target=target;
    pArgs->offsets=offsets;
}